

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

int __thiscall
QHttpNetworkConnectionPrivate::indexOf(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  QIODevice *pQVar1;
  ulong uVar2;
  ulong uVar3;
  QIODevice **ppQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  uVar3 = (ulong)this->activeChannelCount;
  bVar5 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    if (this->channels->socket == socket) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      ppQVar4 = &this->channels[1].socket;
      do {
        if (uVar3 - 1 == uVar2) goto LAB_00200e9e;
        uVar2 = uVar2 + 1;
        pQVar1 = *ppQVar4;
        ppQVar4 = ppQVar4 + 0x21;
      } while (pQVar1 != socket);
      bVar5 = uVar2 < uVar3;
    }
    if (bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return (int)uVar2;
      }
      goto LAB_00200ea6;
    }
  }
LAB_00200e9e:
  indexOf();
LAB_00200ea6:
  __stack_chk_fail();
}

Assistant:

int QHttpNetworkConnectionPrivate::indexOf(QIODevice *socket) const
{
    for (int i = 0; i < activeChannelCount; ++i)
        if (channels[i].socket == socket)
            return i;

    qFatal("Called with unknown socket object.");
    return 0;
}